

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:501:11),_kj::_::PropagateException>_>
::disposeImpl(HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:501:11),_kj::_::PropagateException>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    TransformPromiseNodeBase::dropDependency((TransformPromiseNodeBase *)pointer);
    TransformPromiseNodeBase::~TransformPromiseNodeBase((TransformPromiseNodeBase *)pointer);
  }
  operator_delete(pointer,0x30);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }